

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStream.hpp
# Opt level: O1

StringStream<char> * __thiscall
Qentem::StringStream<char>::operator=(StringStream<char> *this,char *str)

{
  long lVar1;
  SizeT new_length;
  uint new_capacity;
  long lVar2;
  
  this->length_ = 0;
  lVar2 = 0;
  if ((str != (char *)0x0) && (*str != '\0')) {
    lVar2 = 0;
    do {
      lVar1 = lVar2 + 1;
      lVar2 = lVar2 + 1;
    } while (str[lVar1] != '\0');
  }
  new_capacity = (uint)lVar2;
  if (this->capacity_ < new_capacity) {
    expand(this,new_capacity);
  }
  Memory::Copy<unsigned_int>(this->storage_ + this->length_,str,new_capacity);
  this->length_ = new_capacity;
  return this;
}

Assistant:

StringStream &operator=(const Char_T *str) {
        Clear();
        write(str, StringUtils::Count(str));

        return *this;
    }